

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_value.cpp
# Opt level: O3

void duckdb::ListValueFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  undefined8 *puVar1;
  PhysicalType PVar2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined8 uVar5;
  long lVar6;
  byte bVar7;
  DataChunk *pDVar8;
  undefined1 auVar9 [8];
  element_type *peVar10;
  reference pvVar11;
  Vector *pVVar12;
  TemplatedValidityData<unsigned_long> *pTVar13;
  Vector *pVVar14;
  reference pvVar15;
  _Head_base<0UL,_unsigned_long_*,_false> _Var16;
  LogicalType *pLVar17;
  idx_t iVar18;
  ulong uVar19;
  idx_t i;
  size_type __n;
  long lVar20;
  pointer pVVar21;
  idx_t iVar22;
  data_ptr_t pdVar23;
  ulong uVar24;
  idx_t iVar25;
  idx_t idx_in_entry;
  pointer pVVar26;
  undefined1 *puVar27;
  VectorType *pVVar28;
  shared_ptr<duckdb::ExtraTypeInfo,_true> *psVar29;
  bool bVar30;
  string_t sVar31;
  idx_t offset_sum;
  value_type list;
  vector<unsigned_long,_true> col_offsets;
  DataChunk local_168;
  DataChunk *local_128;
  Vector *local_120;
  pointer local_118;
  pointer local_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [8];
  element_type *apeStack_f0 [6];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  Value local_88;
  long local_40;
  data_ptr_t local_38;
  
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  if ((args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pdVar23 = result->data;
    pdVar23[0] = '\0';
    pdVar23[1] = '\0';
    pdVar23[2] = '\0';
    pdVar23[3] = '\0';
    pdVar23[4] = '\0';
    pdVar23[5] = '\0';
    pdVar23[6] = '\0';
    pdVar23[7] = '\0';
    pdVar23[8] = '\0';
    pdVar23[9] = '\0';
    pdVar23[10] = '\0';
    pdVar23[0xb] = '\0';
    pdVar23[0xc] = '\0';
    pdVar23[0xd] = '\0';
    pdVar23[0xe] = '\0';
    pdVar23[0xf] = '\0';
    return;
  }
  __n = 0;
  do {
    pvVar11 = vector<duckdb::Vector,_true>::operator[](&args->data,__n);
    if (pvVar11->vector_type != CONSTANT_VECTOR) {
      Vector::SetVectorType(result,FLAT_VECTOR);
    }
    __n = __n + 1;
  } while (__n < (ulong)(((long)(args->data).
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(args->data).
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5)
          );
  pVVar12 = ListVector::GetEntry(result);
  PVar2 = (pVVar12->type).physical_type_;
  local_128 = args;
  local_120 = result;
  if (PVar2 < VARCHAR) {
    switch(PVar2) {
    case BOOL:
    case INT8:
      local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      pVVar21 = (pointer)(((long)local_168.vector_caches.
                                 super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                 .
                                 super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                 ._M_impl.super__Vector_impl_data._M_start -
                           (long)local_168.data.
                                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                 ._M_impl.super__Vector_impl_data._M_finish >> 3) *
                         0x4ec4ec4ec4ec4ec5);
      ListVector::Reserve(result,args->count * (long)pVVar21);
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)result->data;
      pVVar12 = ListVector::GetEntry(result);
      pdVar23 = pVVar12->data;
      FlatVector::VerifyFlatVector(pVVar12);
      DataChunk::ToUnifiedFormat(&local_168);
      uVar19 = args->count;
      if (uVar19 == 0) {
        uVar19 = 0;
      }
      else {
        local_168.count =
             (idx_t)&(pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        local_168.vector_caches.
        super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
        super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)(&pVVar21->vector_type + (pVVar21 == (pointer)0x0));
        psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)0x0;
        uVar24 = 0;
        local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = pVVar21;
        do {
          if ((pointer)local_168.vector_caches.
                       super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                       super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                       ._M_impl.super__Vector_impl_data._M_start !=
              local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            lVar20 = 0x10;
            pVVar28 = (VectorType *)
                      local_168.vector_caches.
                      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            local_168.capacity = (idx_t)psVar29;
            do {
              lVar3 = **(long **)((long)local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar20 + -0x10);
              uVar19 = uVar24;
              if (lVar3 != 0) {
                uVar19 = (ulong)*(uint *)(lVar3 + uVar24 * 4);
              }
              lVar3 = *(long *)((long)&(local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->vector_type +
                               lVar20);
              if ((lVar3 == 0) ||
                 ((*(ulong *)(lVar3 + (uVar19 >> 6) * 8) >> (uVar19 & 0x3f) & 1) != 0)) {
                pdVar23[(long)psVar29] =
                     *(data_t *)
                      (*(long *)((long)local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar20 + -8) +
                      uVar19);
              }
              else {
                _Var16._M_head_impl =
                     (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (_Var16._M_head_impl == (unsigned_long *)0x0) {
                  local_88.type_._0_8_ =
                       (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)local_f8,(unsigned_long *)&local_88);
                  peVar10 = apeStack_f0[0];
                  auVar9 = local_f8;
                  local_f8 = (undefined1  [8])0x0;
                  apeStack_f0[0] = (element_type *)0x0;
                  p_Var4 = (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)auVar9;
                  (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar10;
                  if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
                     apeStack_f0[0] != (element_type *)0x0)) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apeStack_f0[0]);
                  }
                  pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)local_168.count);
                  _Var16._M_head_impl =
                       (pTVar13->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       _Var16._M_head_impl;
                }
                bVar7 = (byte)psVar29 & 0x3f;
                _Var16._M_head_impl[(ulong)psVar29 >> 6] =
                     _Var16._M_head_impl[(ulong)psVar29 >> 6] &
                     (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
              }
              psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                        ((long)&(psVar29->internal).
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + 1);
              lVar20 = lVar20 + 0x48;
              pVVar28 = pVVar28 + -1;
            } while (pVVar28 != (data_ptr_t)0x0);
            uVar19 = local_128->count;
            psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)local_168.capacity;
            pVVar21 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          }
          *(ulong *)((long)&(local_168.vector_caches.
                             super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             .
                             super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->buffer +
                    uVar24 * 0x10) = uVar24 * (long)pVVar21;
          *(pointer *)
           (&((LogicalType *)
             ((long)local_168.vector_caches.
                    super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 8))->id_ + uVar24 * 0x10) =
               pVVar21;
          uVar24 = uVar24 + 1;
          psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                    (&pVVar21->vector_type + (long)&psVar29->internal);
        } while (uVar24 < uVar19);
      }
      ListVector::SetListSize(local_120,uVar19 * (long)pVVar21);
      break;
    case UINT8:
      local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      pVVar21 = (pointer)(((long)local_168.vector_caches.
                                 super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                 .
                                 super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                 ._M_impl.super__Vector_impl_data._M_start -
                           (long)local_168.data.
                                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                 ._M_impl.super__Vector_impl_data._M_finish >> 3) *
                         0x4ec4ec4ec4ec4ec5);
      ListVector::Reserve(result,args->count * (long)pVVar21);
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)result->data;
      pVVar12 = ListVector::GetEntry(result);
      pdVar23 = pVVar12->data;
      FlatVector::VerifyFlatVector(pVVar12);
      DataChunk::ToUnifiedFormat(&local_168);
      uVar19 = args->count;
      if (uVar19 == 0) {
        uVar19 = 0;
      }
      else {
        local_168.count =
             (idx_t)&(pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        local_168.vector_caches.
        super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
        super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)(&pVVar21->vector_type + (pVVar21 == (pointer)0x0));
        psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)0x0;
        uVar24 = 0;
        local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = pVVar21;
        do {
          if ((pointer)local_168.vector_caches.
                       super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                       super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                       ._M_impl.super__Vector_impl_data._M_start !=
              local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            lVar20 = 0x10;
            pVVar28 = (VectorType *)
                      local_168.vector_caches.
                      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            local_168.capacity = (idx_t)psVar29;
            do {
              lVar3 = **(long **)((long)local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar20 + -0x10);
              uVar19 = uVar24;
              if (lVar3 != 0) {
                uVar19 = (ulong)*(uint *)(lVar3 + uVar24 * 4);
              }
              lVar3 = *(long *)((long)&(local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->vector_type +
                               lVar20);
              if ((lVar3 == 0) ||
                 ((*(ulong *)(lVar3 + (uVar19 >> 6) * 8) >> (uVar19 & 0x3f) & 1) != 0)) {
                pdVar23[(long)psVar29] =
                     *(data_t *)
                      (*(long *)((long)local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar20 + -8) +
                      uVar19);
              }
              else {
                _Var16._M_head_impl =
                     (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (_Var16._M_head_impl == (unsigned_long *)0x0) {
                  local_88.type_._0_8_ =
                       (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)local_f8,(unsigned_long *)&local_88);
                  peVar10 = apeStack_f0[0];
                  auVar9 = local_f8;
                  local_f8 = (undefined1  [8])0x0;
                  apeStack_f0[0] = (element_type *)0x0;
                  p_Var4 = (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)auVar9;
                  (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar10;
                  if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
                     apeStack_f0[0] != (element_type *)0x0)) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apeStack_f0[0]);
                  }
                  pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)local_168.count);
                  _Var16._M_head_impl =
                       (pTVar13->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       _Var16._M_head_impl;
                }
                bVar7 = (byte)psVar29 & 0x3f;
                _Var16._M_head_impl[(ulong)psVar29 >> 6] =
                     _Var16._M_head_impl[(ulong)psVar29 >> 6] &
                     (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
              }
              psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                        ((long)&(psVar29->internal).
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + 1);
              lVar20 = lVar20 + 0x48;
              pVVar28 = pVVar28 + -1;
            } while (pVVar28 != (data_ptr_t)0x0);
            uVar19 = local_128->count;
            psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)local_168.capacity;
            pVVar21 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          }
          *(ulong *)((long)&(local_168.vector_caches.
                             super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             .
                             super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->buffer +
                    uVar24 * 0x10) = uVar24 * (long)pVVar21;
          *(pointer *)
           (&((LogicalType *)
             ((long)local_168.vector_caches.
                    super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 8))->id_ + uVar24 * 0x10) =
               pVVar21;
          uVar24 = uVar24 + 1;
          psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                    (&pVVar21->vector_type + (long)&psVar29->internal);
        } while (uVar24 < uVar19);
      }
      ListVector::SetListSize(local_120,uVar19 * (long)pVVar21);
      break;
    case UINT16:
      local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      pVVar21 = (pointer)(((long)local_168.vector_caches.
                                 super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                 .
                                 super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                 ._M_impl.super__Vector_impl_data._M_start -
                           (long)local_168.data.
                                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                 ._M_impl.super__Vector_impl_data._M_finish >> 3) *
                         0x4ec4ec4ec4ec4ec5);
      ListVector::Reserve(result,args->count * (long)pVVar21);
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)result->data;
      pVVar12 = ListVector::GetEntry(result);
      pdVar23 = pVVar12->data;
      FlatVector::VerifyFlatVector(pVVar12);
      DataChunk::ToUnifiedFormat(&local_168);
      uVar19 = args->count;
      if (uVar19 == 0) {
        uVar19 = 0;
      }
      else {
        local_168.count =
             (idx_t)&(pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        local_168.vector_caches.
        super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
        super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)(&pVVar21->vector_type + (pVVar21 == (pointer)0x0));
        psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)0x0;
        uVar24 = 0;
        local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = pVVar21;
        do {
          if ((pointer)local_168.vector_caches.
                       super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                       super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                       ._M_impl.super__Vector_impl_data._M_start !=
              local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            lVar20 = 8;
            pVVar28 = (VectorType *)
                      local_168.vector_caches.
                      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            local_168.capacity = (idx_t)psVar29;
            do {
              lVar3 = **(long **)((long)local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                 lVar20 * 2 + -0x10);
              uVar19 = uVar24;
              if (lVar3 != 0) {
                uVar19 = (ulong)*(uint *)(lVar3 + uVar24 * 4);
              }
              lVar3 = *(long *)((long)&(local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->vector_type +
                               lVar20 * 2);
              if ((lVar3 == 0) ||
                 ((*(ulong *)(lVar3 + (uVar19 >> 6) * 8) >> (uVar19 & 0x3f) & 1) != 0)) {
                *(undefined2 *)(pdVar23 + (long)psVar29 * 2) =
                     *(undefined2 *)
                      (*(long *)((long)local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar20 * 2 + -8)
                      + uVar19 * 2);
              }
              else {
                _Var16._M_head_impl =
                     (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (_Var16._M_head_impl == (unsigned_long *)0x0) {
                  local_88.type_._0_8_ =
                       (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)local_f8,(unsigned_long *)&local_88);
                  peVar10 = apeStack_f0[0];
                  auVar9 = local_f8;
                  local_f8 = (undefined1  [8])0x0;
                  apeStack_f0[0] = (element_type *)0x0;
                  p_Var4 = (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)auVar9;
                  (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar10;
                  if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
                     apeStack_f0[0] != (element_type *)0x0)) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apeStack_f0[0]);
                  }
                  pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)local_168.count);
                  _Var16._M_head_impl =
                       (pTVar13->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       _Var16._M_head_impl;
                }
                bVar7 = (byte)psVar29 & 0x3f;
                _Var16._M_head_impl[(ulong)psVar29 >> 6] =
                     _Var16._M_head_impl[(ulong)psVar29 >> 6] &
                     (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
              }
              psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                        ((long)&(psVar29->internal).
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + 1);
              lVar20 = lVar20 + 0x24;
              pVVar28 = pVVar28 + -1;
            } while (pVVar28 != (data_ptr_t)0x0);
            uVar19 = local_128->count;
            psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)local_168.capacity;
            pVVar21 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          }
          *(ulong *)((long)&(local_168.vector_caches.
                             super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             .
                             super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->buffer +
                    uVar24 * 0x10) = uVar24 * (long)pVVar21;
          *(pointer *)
           (&((LogicalType *)
             ((long)local_168.vector_caches.
                    super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 8))->id_ + uVar24 * 0x10) =
               pVVar21;
          uVar24 = uVar24 + 1;
          psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                    (&pVVar21->vector_type + (long)&psVar29->internal);
        } while (uVar24 < uVar19);
      }
      ListVector::SetListSize(local_120,uVar19 * (long)pVVar21);
      break;
    case INT16:
      local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      pVVar21 = (pointer)(((long)local_168.vector_caches.
                                 super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                 .
                                 super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                 ._M_impl.super__Vector_impl_data._M_start -
                           (long)local_168.data.
                                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                 ._M_impl.super__Vector_impl_data._M_finish >> 3) *
                         0x4ec4ec4ec4ec4ec5);
      ListVector::Reserve(result,args->count * (long)pVVar21);
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)result->data;
      pVVar12 = ListVector::GetEntry(result);
      pdVar23 = pVVar12->data;
      FlatVector::VerifyFlatVector(pVVar12);
      DataChunk::ToUnifiedFormat(&local_168);
      uVar19 = args->count;
      if (uVar19 == 0) {
        uVar19 = 0;
      }
      else {
        local_168.count =
             (idx_t)&(pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        local_168.vector_caches.
        super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
        super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)(&pVVar21->vector_type + (pVVar21 == (pointer)0x0));
        psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)0x0;
        uVar24 = 0;
        local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = pVVar21;
        do {
          if ((pointer)local_168.vector_caches.
                       super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                       super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                       ._M_impl.super__Vector_impl_data._M_start !=
              local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            lVar20 = 8;
            pVVar28 = (VectorType *)
                      local_168.vector_caches.
                      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            local_168.capacity = (idx_t)psVar29;
            do {
              lVar3 = **(long **)((long)local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                 lVar20 * 2 + -0x10);
              uVar19 = uVar24;
              if (lVar3 != 0) {
                uVar19 = (ulong)*(uint *)(lVar3 + uVar24 * 4);
              }
              lVar3 = *(long *)((long)&(local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->vector_type +
                               lVar20 * 2);
              if ((lVar3 == 0) ||
                 ((*(ulong *)(lVar3 + (uVar19 >> 6) * 8) >> (uVar19 & 0x3f) & 1) != 0)) {
                *(undefined2 *)(pdVar23 + (long)psVar29 * 2) =
                     *(undefined2 *)
                      (*(long *)((long)local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar20 * 2 + -8)
                      + uVar19 * 2);
              }
              else {
                _Var16._M_head_impl =
                     (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (_Var16._M_head_impl == (unsigned_long *)0x0) {
                  local_88.type_._0_8_ =
                       (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)local_f8,(unsigned_long *)&local_88);
                  peVar10 = apeStack_f0[0];
                  auVar9 = local_f8;
                  local_f8 = (undefined1  [8])0x0;
                  apeStack_f0[0] = (element_type *)0x0;
                  p_Var4 = (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)auVar9;
                  (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar10;
                  if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
                     apeStack_f0[0] != (element_type *)0x0)) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apeStack_f0[0]);
                  }
                  pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)local_168.count);
                  _Var16._M_head_impl =
                       (pTVar13->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       _Var16._M_head_impl;
                }
                bVar7 = (byte)psVar29 & 0x3f;
                _Var16._M_head_impl[(ulong)psVar29 >> 6] =
                     _Var16._M_head_impl[(ulong)psVar29 >> 6] &
                     (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
              }
              psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                        ((long)&(psVar29->internal).
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + 1);
              lVar20 = lVar20 + 0x24;
              pVVar28 = pVVar28 + -1;
            } while (pVVar28 != (data_ptr_t)0x0);
            uVar19 = local_128->count;
            psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)local_168.capacity;
            pVVar21 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          }
          *(ulong *)((long)&(local_168.vector_caches.
                             super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             .
                             super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->buffer +
                    uVar24 * 0x10) = uVar24 * (long)pVVar21;
          *(pointer *)
           (&((LogicalType *)
             ((long)local_168.vector_caches.
                    super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 8))->id_ + uVar24 * 0x10) =
               pVVar21;
          uVar24 = uVar24 + 1;
          psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                    (&pVVar21->vector_type + (long)&psVar29->internal);
        } while (uVar24 < uVar19);
      }
      ListVector::SetListSize(local_120,uVar19 * (long)pVVar21);
      break;
    case UINT32:
      local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      pVVar21 = (pointer)(((long)local_168.vector_caches.
                                 super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                 .
                                 super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                 ._M_impl.super__Vector_impl_data._M_start -
                           (long)local_168.data.
                                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                 ._M_impl.super__Vector_impl_data._M_finish >> 3) *
                         0x4ec4ec4ec4ec4ec5);
      ListVector::Reserve(result,args->count * (long)pVVar21);
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)result->data;
      pVVar12 = ListVector::GetEntry(result);
      pdVar23 = pVVar12->data;
      FlatVector::VerifyFlatVector(pVVar12);
      DataChunk::ToUnifiedFormat(&local_168);
      uVar19 = args->count;
      if (uVar19 == 0) {
        uVar19 = 0;
      }
      else {
        local_168.count =
             (idx_t)&(pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        local_168.vector_caches.
        super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
        super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)(&pVVar21->vector_type + (pVVar21 == (pointer)0x0));
        psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)0x0;
        uVar24 = 0;
        local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = pVVar21;
        do {
          if ((pointer)local_168.vector_caches.
                       super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                       super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                       ._M_impl.super__Vector_impl_data._M_start !=
              local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            lVar20 = 4;
            pVVar28 = (VectorType *)
                      local_168.vector_caches.
                      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            local_168.capacity = (idx_t)psVar29;
            do {
              lVar3 = **(long **)((long)local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                 lVar20 * 4 + -0x10);
              uVar19 = uVar24;
              if (lVar3 != 0) {
                uVar19 = (ulong)*(uint *)(lVar3 + uVar24 * 4);
              }
              lVar3 = *(long *)((long)&(local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->vector_type +
                               lVar20 * 4);
              if ((lVar3 == 0) ||
                 ((*(ulong *)(lVar3 + (uVar19 >> 6) * 8) >> (uVar19 & 0x3f) & 1) != 0)) {
                *(undefined4 *)(pdVar23 + (long)psVar29 * 4) =
                     *(undefined4 *)
                      (*(long *)((long)local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar20 * 4 + -8)
                      + uVar19 * 4);
              }
              else {
                _Var16._M_head_impl =
                     (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (_Var16._M_head_impl == (unsigned_long *)0x0) {
                  local_88.type_._0_8_ =
                       (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)local_f8,(unsigned_long *)&local_88);
                  peVar10 = apeStack_f0[0];
                  auVar9 = local_f8;
                  local_f8 = (undefined1  [8])0x0;
                  apeStack_f0[0] = (element_type *)0x0;
                  p_Var4 = (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)auVar9;
                  (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar10;
                  if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
                     apeStack_f0[0] != (element_type *)0x0)) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apeStack_f0[0]);
                  }
                  pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)local_168.count);
                  _Var16._M_head_impl =
                       (pTVar13->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       _Var16._M_head_impl;
                }
                bVar7 = (byte)psVar29 & 0x3f;
                _Var16._M_head_impl[(ulong)psVar29 >> 6] =
                     _Var16._M_head_impl[(ulong)psVar29 >> 6] &
                     (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
              }
              psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                        ((long)&(psVar29->internal).
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + 1);
              lVar20 = lVar20 + 0x12;
              pVVar28 = pVVar28 + -1;
            } while (pVVar28 != (data_ptr_t)0x0);
            uVar19 = local_128->count;
            psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)local_168.capacity;
            pVVar21 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          }
          *(ulong *)((long)&(local_168.vector_caches.
                             super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             .
                             super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->buffer +
                    uVar24 * 0x10) = uVar24 * (long)pVVar21;
          *(pointer *)
           (&((LogicalType *)
             ((long)local_168.vector_caches.
                    super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 8))->id_ + uVar24 * 0x10) =
               pVVar21;
          uVar24 = uVar24 + 1;
          psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                    (&pVVar21->vector_type + (long)&psVar29->internal);
        } while (uVar24 < uVar19);
      }
      ListVector::SetListSize(local_120,uVar19 * (long)pVVar21);
      break;
    case INT32:
      local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      pVVar21 = (pointer)(((long)local_168.vector_caches.
                                 super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                 .
                                 super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                 ._M_impl.super__Vector_impl_data._M_start -
                           (long)local_168.data.
                                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                 ._M_impl.super__Vector_impl_data._M_finish >> 3) *
                         0x4ec4ec4ec4ec4ec5);
      ListVector::Reserve(result,args->count * (long)pVVar21);
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)result->data;
      pVVar12 = ListVector::GetEntry(result);
      pdVar23 = pVVar12->data;
      FlatVector::VerifyFlatVector(pVVar12);
      DataChunk::ToUnifiedFormat(&local_168);
      uVar19 = args->count;
      if (uVar19 == 0) {
        uVar19 = 0;
      }
      else {
        local_168.count =
             (idx_t)&(pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        local_168.vector_caches.
        super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
        super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)(&pVVar21->vector_type + (pVVar21 == (pointer)0x0));
        psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)0x0;
        uVar24 = 0;
        local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = pVVar21;
        do {
          if ((pointer)local_168.vector_caches.
                       super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                       super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                       ._M_impl.super__Vector_impl_data._M_start !=
              local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            lVar20 = 4;
            pVVar28 = (VectorType *)
                      local_168.vector_caches.
                      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            local_168.capacity = (idx_t)psVar29;
            do {
              lVar3 = **(long **)((long)local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                 lVar20 * 4 + -0x10);
              uVar19 = uVar24;
              if (lVar3 != 0) {
                uVar19 = (ulong)*(uint *)(lVar3 + uVar24 * 4);
              }
              lVar3 = *(long *)((long)&(local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->vector_type +
                               lVar20 * 4);
              if ((lVar3 == 0) ||
                 ((*(ulong *)(lVar3 + (uVar19 >> 6) * 8) >> (uVar19 & 0x3f) & 1) != 0)) {
                *(undefined4 *)(pdVar23 + (long)psVar29 * 4) =
                     *(undefined4 *)
                      (*(long *)((long)local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar20 * 4 + -8)
                      + uVar19 * 4);
              }
              else {
                _Var16._M_head_impl =
                     (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (_Var16._M_head_impl == (unsigned_long *)0x0) {
                  local_88.type_._0_8_ =
                       (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)local_f8,(unsigned_long *)&local_88);
                  peVar10 = apeStack_f0[0];
                  auVar9 = local_f8;
                  local_f8 = (undefined1  [8])0x0;
                  apeStack_f0[0] = (element_type *)0x0;
                  p_Var4 = (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)auVar9;
                  (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar10;
                  if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
                     apeStack_f0[0] != (element_type *)0x0)) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apeStack_f0[0]);
                  }
                  pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)local_168.count);
                  _Var16._M_head_impl =
                       (pTVar13->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       _Var16._M_head_impl;
                }
                bVar7 = (byte)psVar29 & 0x3f;
                _Var16._M_head_impl[(ulong)psVar29 >> 6] =
                     _Var16._M_head_impl[(ulong)psVar29 >> 6] &
                     (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
              }
              psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                        ((long)&(psVar29->internal).
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + 1);
              lVar20 = lVar20 + 0x12;
              pVVar28 = pVVar28 + -1;
            } while (pVVar28 != (data_ptr_t)0x0);
            uVar19 = local_128->count;
            psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)local_168.capacity;
            pVVar21 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          }
          *(ulong *)((long)&(local_168.vector_caches.
                             super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             .
                             super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->buffer +
                    uVar24 * 0x10) = uVar24 * (long)pVVar21;
          *(pointer *)
           (&((LogicalType *)
             ((long)local_168.vector_caches.
                    super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 8))->id_ + uVar24 * 0x10) =
               pVVar21;
          uVar24 = uVar24 + 1;
          psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                    (&pVVar21->vector_type + (long)&psVar29->internal);
        } while (uVar24 < uVar19);
      }
      ListVector::SetListSize(local_120,uVar19 * (long)pVVar21);
      break;
    case UINT64:
      local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      pVVar21 = (pointer)(((long)local_168.vector_caches.
                                 super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                 .
                                 super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                 ._M_impl.super__Vector_impl_data._M_start -
                           (long)local_168.data.
                                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                 ._M_impl.super__Vector_impl_data._M_finish >> 3) *
                         0x4ec4ec4ec4ec4ec5);
      ListVector::Reserve(result,args->count * (long)pVVar21);
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)result->data;
      pVVar12 = ListVector::GetEntry(result);
      pdVar23 = pVVar12->data;
      FlatVector::VerifyFlatVector(pVVar12);
      DataChunk::ToUnifiedFormat(&local_168);
      uVar19 = args->count;
      if (uVar19 == 0) {
        uVar19 = 0;
      }
      else {
        local_168.count =
             (idx_t)&(pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        local_168.vector_caches.
        super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
        super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)(&pVVar21->vector_type + (pVVar21 == (pointer)0x0));
        psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)0x0;
        uVar24 = 0;
        local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = pVVar21;
        do {
          if ((pointer)local_168.vector_caches.
                       super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                       super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                       ._M_impl.super__Vector_impl_data._M_start !=
              local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            lVar20 = 2;
            pVVar28 = (VectorType *)
                      local_168.vector_caches.
                      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            local_168.capacity = (idx_t)psVar29;
            do {
              lVar3 = **(long **)((long)local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                 lVar20 * 8 + -0x10);
              uVar19 = uVar24;
              if (lVar3 != 0) {
                uVar19 = (ulong)*(uint *)(lVar3 + uVar24 * 4);
              }
              if ((*(SelectionVector **)
                    ((long)&(local_168.data.
                             super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             _M_impl.super__Vector_impl_data._M_start)->vector_type + lVar20 * 8) ==
                   (SelectionVector *)0x0) ||
                 (((ulong)(&(*(SelectionVector **)
                              ((long)&(local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->vector_type +
                              lVar20 * 8))->sel_vector)[uVar19 >> 6] >> (uVar19 & 0x3f) & 1) != 0))
              {
                *(undefined8 *)(pdVar23 + (long)psVar29 * 8) =
                     *(undefined8 *)
                      (*(long *)((long)local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar20 * 8 + -8)
                      + uVar19 * 8);
              }
              else {
                _Var16._M_head_impl =
                     (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (_Var16._M_head_impl == (unsigned_long *)0x0) {
                  local_88.type_._0_8_ =
                       (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)local_f8,(unsigned_long *)&local_88);
                  peVar10 = apeStack_f0[0];
                  auVar9 = local_f8;
                  local_f8 = (undefined1  [8])0x0;
                  apeStack_f0[0] = (element_type *)0x0;
                  p_Var4 = (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)auVar9;
                  (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar10;
                  if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
                     apeStack_f0[0] != (element_type *)0x0)) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apeStack_f0[0]);
                  }
                  pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)local_168.count);
                  _Var16._M_head_impl =
                       (pTVar13->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       _Var16._M_head_impl;
                }
                bVar7 = (byte)psVar29 & 0x3f;
                _Var16._M_head_impl[(ulong)psVar29 >> 6] =
                     _Var16._M_head_impl[(ulong)psVar29 >> 6] &
                     (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
              }
              psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                        ((long)&(psVar29->internal).
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + 1);
              lVar20 = lVar20 + 9;
              pVVar28 = pVVar28 + -1;
            } while (pVVar28 != (data_ptr_t)0x0);
            uVar19 = local_128->count;
            psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)local_168.capacity;
            pVVar21 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          }
          *(ulong *)((long)&(local_168.vector_caches.
                             super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             .
                             super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->buffer +
                    uVar24 * 0x10) = uVar24 * (long)pVVar21;
          *(pointer *)
           (&((LogicalType *)
             ((long)local_168.vector_caches.
                    super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 8))->id_ + uVar24 * 0x10) =
               pVVar21;
          uVar24 = uVar24 + 1;
          psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                    (&pVVar21->vector_type + (long)&psVar29->internal);
        } while (uVar24 < uVar19);
      }
      ListVector::SetListSize(local_120,uVar19 * (long)pVVar21);
      break;
    case INT64:
      local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      pVVar21 = (pointer)(((long)local_168.vector_caches.
                                 super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                 .
                                 super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                 ._M_impl.super__Vector_impl_data._M_start -
                           (long)local_168.data.
                                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                 ._M_impl.super__Vector_impl_data._M_finish >> 3) *
                         0x4ec4ec4ec4ec4ec5);
      ListVector::Reserve(result,args->count * (long)pVVar21);
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)result->data;
      pVVar12 = ListVector::GetEntry(result);
      pdVar23 = pVVar12->data;
      FlatVector::VerifyFlatVector(pVVar12);
      DataChunk::ToUnifiedFormat(&local_168);
      uVar19 = args->count;
      if (uVar19 == 0) {
        uVar19 = 0;
      }
      else {
        local_168.count =
             (idx_t)&(pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        local_168.vector_caches.
        super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
        super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)(&pVVar21->vector_type + (pVVar21 == (pointer)0x0));
        psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)0x0;
        uVar24 = 0;
        local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = pVVar21;
        do {
          if ((pointer)local_168.vector_caches.
                       super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                       super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                       ._M_impl.super__Vector_impl_data._M_start !=
              local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            lVar20 = 2;
            pVVar28 = (VectorType *)
                      local_168.vector_caches.
                      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            local_168.capacity = (idx_t)psVar29;
            do {
              lVar3 = **(long **)((long)local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                 lVar20 * 8 + -0x10);
              uVar19 = uVar24;
              if (lVar3 != 0) {
                uVar19 = (ulong)*(uint *)(lVar3 + uVar24 * 4);
              }
              if ((*(SelectionVector **)
                    ((long)&(local_168.data.
                             super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             _M_impl.super__Vector_impl_data._M_start)->vector_type + lVar20 * 8) ==
                   (SelectionVector *)0x0) ||
                 (((ulong)(&(*(SelectionVector **)
                              ((long)&(local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->vector_type +
                              lVar20 * 8))->sel_vector)[uVar19 >> 6] >> (uVar19 & 0x3f) & 1) != 0))
              {
                *(undefined8 *)(pdVar23 + (long)psVar29 * 8) =
                     *(undefined8 *)
                      (*(long *)((long)local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar20 * 8 + -8)
                      + uVar19 * 8);
              }
              else {
                _Var16._M_head_impl =
                     (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (_Var16._M_head_impl == (unsigned_long *)0x0) {
                  local_88.type_._0_8_ =
                       (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)local_f8,(unsigned_long *)&local_88);
                  peVar10 = apeStack_f0[0];
                  auVar9 = local_f8;
                  local_f8 = (undefined1  [8])0x0;
                  apeStack_f0[0] = (element_type *)0x0;
                  p_Var4 = (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)auVar9;
                  (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar10;
                  if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
                     apeStack_f0[0] != (element_type *)0x0)) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apeStack_f0[0]);
                  }
                  pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)local_168.count);
                  _Var16._M_head_impl =
                       (pTVar13->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       _Var16._M_head_impl;
                }
                bVar7 = (byte)psVar29 & 0x3f;
                _Var16._M_head_impl[(ulong)psVar29 >> 6] =
                     _Var16._M_head_impl[(ulong)psVar29 >> 6] &
                     (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
              }
              psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                        ((long)&(psVar29->internal).
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + 1);
              lVar20 = lVar20 + 9;
              pVVar28 = pVVar28 + -1;
            } while (pVVar28 != (data_ptr_t)0x0);
            uVar19 = local_128->count;
            psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)local_168.capacity;
            pVVar21 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          }
          *(ulong *)((long)&(local_168.vector_caches.
                             super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             .
                             super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->buffer +
                    uVar24 * 0x10) = uVar24 * (long)pVVar21;
          *(pointer *)
           (&((LogicalType *)
             ((long)local_168.vector_caches.
                    super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 8))->id_ + uVar24 * 0x10) =
               pVVar21;
          uVar24 = uVar24 + 1;
          psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                    (&pVVar21->vector_type + (long)&psVar29->internal);
        } while (uVar24 < uVar19);
      }
      ListVector::SetListSize(local_120,uVar19 * (long)pVVar21);
      break;
    default:
switchD_00f98dc9_caseD_a:
      pLVar17 = ListType::GetChildType(&result->type);
      if (args->count == 0) {
        return;
      }
      local_168.capacity = (idx_t)local_120->data;
      iVar25 = 0;
      do {
        iVar22 = local_168.capacity;
        iVar18 = ListVector::GetListSize(local_120);
        local_168.count = iVar25 * 0x10;
        *(idx_t *)(iVar22 + local_168.count) = iVar18;
        if ((args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar19 = 0;
        }
        else {
          iVar22 = 0;
          do {
            DataChunk::GetValue(&local_88,local_128,iVar22,iVar25);
            Value::DefaultCastAs((Value *)local_f8,&local_88,pLVar17,false);
            Value::~Value(&local_88);
            ListVector::PushBack(local_120,(Value *)local_f8);
            Value::~Value((Value *)local_f8);
            iVar22 = iVar22 + 1;
            uVar19 = ((long)(local_128->data).
                            super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_128->data).
                            super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5;
          } while (iVar22 < uVar19);
        }
        *(ulong *)(local_168.capacity +
                  (long)&(((original *)local_168.count)->
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         )._M_refcount) = uVar19;
        iVar25 = iVar25 + 1;
        args = local_128;
      } while (iVar25 < local_128->count);
      return;
    case FLOAT:
      local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      pVVar21 = (pointer)(((long)local_168.vector_caches.
                                 super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                 .
                                 super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                 ._M_impl.super__Vector_impl_data._M_start -
                           (long)local_168.data.
                                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                 ._M_impl.super__Vector_impl_data._M_finish >> 3) *
                         0x4ec4ec4ec4ec4ec5);
      ListVector::Reserve(result,args->count * (long)pVVar21);
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)result->data;
      pVVar12 = ListVector::GetEntry(result);
      pdVar23 = pVVar12->data;
      FlatVector::VerifyFlatVector(pVVar12);
      DataChunk::ToUnifiedFormat(&local_168);
      uVar19 = args->count;
      if (uVar19 == 0) {
        uVar19 = 0;
      }
      else {
        local_168.count =
             (idx_t)&(pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        local_168.vector_caches.
        super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
        super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)(&pVVar21->vector_type + (pVVar21 == (pointer)0x0));
        psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)0x0;
        uVar24 = 0;
        local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = pVVar21;
        do {
          if ((pointer)local_168.vector_caches.
                       super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                       super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                       ._M_impl.super__Vector_impl_data._M_start !=
              local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            lVar20 = 4;
            pVVar28 = (VectorType *)
                      local_168.vector_caches.
                      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            local_168.capacity = (idx_t)psVar29;
            do {
              lVar3 = **(long **)((long)local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                 lVar20 * 4 + -0x10);
              uVar19 = uVar24;
              if (lVar3 != 0) {
                uVar19 = (ulong)*(uint *)(lVar3 + uVar24 * 4);
              }
              lVar3 = *(long *)((long)&(local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->vector_type +
                               lVar20 * 4);
              if ((lVar3 == 0) ||
                 ((*(ulong *)(lVar3 + (uVar19 >> 6) * 8) >> (uVar19 & 0x3f) & 1) != 0)) {
                *(undefined4 *)(pdVar23 + (long)psVar29 * 4) =
                     *(undefined4 *)
                      (*(long *)((long)local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar20 * 4 + -8)
                      + uVar19 * 4);
              }
              else {
                _Var16._M_head_impl =
                     (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (_Var16._M_head_impl == (unsigned_long *)0x0) {
                  local_88.type_._0_8_ =
                       (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)local_f8,(unsigned_long *)&local_88);
                  peVar10 = apeStack_f0[0];
                  auVar9 = local_f8;
                  local_f8 = (undefined1  [8])0x0;
                  apeStack_f0[0] = (element_type *)0x0;
                  p_Var4 = (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)auVar9;
                  (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar10;
                  if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
                     apeStack_f0[0] != (element_type *)0x0)) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apeStack_f0[0]);
                  }
                  pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)local_168.count);
                  _Var16._M_head_impl =
                       (pTVar13->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       _Var16._M_head_impl;
                }
                bVar7 = (byte)psVar29 & 0x3f;
                _Var16._M_head_impl[(ulong)psVar29 >> 6] =
                     _Var16._M_head_impl[(ulong)psVar29 >> 6] &
                     (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
              }
              psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                        ((long)&(psVar29->internal).
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + 1);
              lVar20 = lVar20 + 0x12;
              pVVar28 = pVVar28 + -1;
            } while (pVVar28 != (data_ptr_t)0x0);
            uVar19 = local_128->count;
            psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)local_168.capacity;
            pVVar21 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          }
          *(ulong *)((long)&(local_168.vector_caches.
                             super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             .
                             super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->buffer +
                    uVar24 * 0x10) = uVar24 * (long)pVVar21;
          *(pointer *)
           (&((LogicalType *)
             ((long)local_168.vector_caches.
                    super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 8))->id_ + uVar24 * 0x10) =
               pVVar21;
          uVar24 = uVar24 + 1;
          psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                    (&pVVar21->vector_type + (long)&psVar29->internal);
        } while (uVar24 < uVar19);
      }
      ListVector::SetListSize(local_120,uVar19 * (long)pVVar21);
      break;
    case DOUBLE:
      local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      pVVar21 = (pointer)(((long)local_168.vector_caches.
                                 super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                 .
                                 super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                 ._M_impl.super__Vector_impl_data._M_start -
                           (long)local_168.data.
                                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                 ._M_impl.super__Vector_impl_data._M_finish >> 3) *
                         0x4ec4ec4ec4ec4ec5);
      ListVector::Reserve(result,args->count * (long)pVVar21);
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)result->data;
      pVVar12 = ListVector::GetEntry(result);
      pdVar23 = pVVar12->data;
      FlatVector::VerifyFlatVector(pVVar12);
      DataChunk::ToUnifiedFormat(&local_168);
      uVar19 = args->count;
      if (uVar19 == 0) {
        uVar19 = 0;
      }
      else {
        local_168.count =
             (idx_t)&(pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        local_168.vector_caches.
        super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
        super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)(&pVVar21->vector_type + (pVVar21 == (pointer)0x0));
        psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)0x0;
        uVar24 = 0;
        local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = pVVar21;
        do {
          if ((pointer)local_168.vector_caches.
                       super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                       super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                       ._M_impl.super__Vector_impl_data._M_start !=
              local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            lVar20 = 2;
            pVVar28 = (VectorType *)
                      local_168.vector_caches.
                      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            local_168.capacity = (idx_t)psVar29;
            do {
              lVar3 = **(long **)((long)local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                 lVar20 * 8 + -0x10);
              uVar19 = uVar24;
              if (lVar3 != 0) {
                uVar19 = (ulong)*(uint *)(lVar3 + uVar24 * 4);
              }
              if ((*(SelectionVector **)
                    ((long)&(local_168.data.
                             super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                             _M_impl.super__Vector_impl_data._M_start)->vector_type + lVar20 * 8) ==
                   (SelectionVector *)0x0) ||
                 (((ulong)(&(*(SelectionVector **)
                              ((long)&(local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->vector_type +
                              lVar20 * 8))->sel_vector)[uVar19 >> 6] >> (uVar19 & 0x3f) & 1) != 0))
              {
                *(undefined8 *)(pdVar23 + (long)psVar29 * 8) =
                     *(undefined8 *)
                      (*(long *)((long)local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar20 * 8 + -8)
                      + uVar19 * 8);
              }
              else {
                _Var16._M_head_impl =
                     (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (_Var16._M_head_impl == (unsigned_long *)0x0) {
                  local_88.type_._0_8_ =
                       (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)local_f8,(unsigned_long *)&local_88);
                  peVar10 = apeStack_f0[0];
                  auVar9 = local_f8;
                  local_f8 = (undefined1  [8])0x0;
                  apeStack_f0[0] = (element_type *)0x0;
                  p_Var4 = (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)auVar9;
                  (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar10;
                  if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
                     apeStack_f0[0] != (element_type *)0x0)) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apeStack_f0[0]);
                  }
                  pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)local_168.count);
                  _Var16._M_head_impl =
                       (pTVar13->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       _Var16._M_head_impl;
                }
                bVar7 = (byte)psVar29 & 0x3f;
                _Var16._M_head_impl[(ulong)psVar29 >> 6] =
                     _Var16._M_head_impl[(ulong)psVar29 >> 6] &
                     (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
              }
              psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                        ((long)&(psVar29->internal).
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + 1);
              lVar20 = lVar20 + 9;
              pVVar28 = pVVar28 + -1;
            } while (pVVar28 != (data_ptr_t)0x0);
            uVar19 = local_128->count;
            psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)local_168.capacity;
            pVVar21 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
          }
          *(ulong *)((long)&(local_168.vector_caches.
                             super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             .
                             super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->buffer +
                    uVar24 * 0x10) = uVar24 * (long)pVVar21;
          *(pointer *)
           (&((LogicalType *)
             ((long)local_168.vector_caches.
                    super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 8))->id_ + uVar24 * 0x10) =
               pVVar21;
          uVar24 = uVar24 + 1;
          psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                    (&pVVar21->vector_type + (long)&psVar29->internal);
        } while (uVar24 < uVar19);
      }
      ListVector::SetListSize(local_120,uVar19 * (long)pVVar21);
      break;
    case INTERVAL:
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      lVar20 = (long)local_168.vector_caches.
                     super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                     super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage -
               (long)local_168.vector_caches.
                     super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                     super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3;
      pVVar21 = (pointer)(lVar20 * 0x4ec4ec4ec4ec4ec5);
      ListVector::Reserve(result,args->count * (long)pVVar21);
      local_168.vector_caches.
      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)result->data;
      pVVar12 = ListVector::GetEntry(result);
      psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)pVVar12->data;
      FlatVector::VerifyFlatVector(pVVar12);
      DataChunk::ToUnifiedFormat(&local_168);
      uVar19 = args->count;
      if (uVar19 == 0) {
        uVar19 = 0;
      }
      else {
        local_168.count =
             (idx_t)&(pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        local_110 = (pointer)((long)pVVar21 + (ulong)(pVVar21 == (pointer)0x0));
        local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)(lVar20 * -0x13b13b13b13b13b0);
        pVVar26 = (pointer)0x0;
        uVar24 = 0;
        local_118 = pVVar21;
        do {
          if (local_168.vector_caches.
              super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
              super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage !=
              local_168.vector_caches.
              super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
              super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
              super__Vector_impl_data._M_start) {
            lVar20 = 0x10;
            pVVar21 = local_110;
            local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_finish = pVVar26;
            local_168.capacity = (idx_t)psVar29;
            do {
              lVar3 = **(long **)((long)local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar20 + -0x10);
              uVar19 = uVar24;
              if (lVar3 != 0) {
                uVar19 = (ulong)*(uint *)(lVar3 + uVar24 * 4);
              }
              lVar3 = *(long *)((long)&(local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->vector_type +
                               lVar20);
              if ((lVar3 == 0) ||
                 ((*(ulong *)(lVar3 + (uVar19 >> 6) * 8) >> (uVar19 & 0x3f) & 1) != 0)) {
                puVar1 = (undefined8 *)
                         (*(long *)((long)local_168.data.
                                          super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                          .
                                          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar20 + -8) +
                         uVar19 * 0x10);
                uVar5 = puVar1[1];
                *(undefined8 *)&psVar29->internal = *puVar1;
                pLVar17 = (LogicalType *)((long)&psVar29->internal + 8);
                pLVar17->id_ = (char)uVar5;
                pLVar17->physical_type_ = (char)((ulong)uVar5 >> 8);
                *(int6 *)&pLVar17->field_0x2 = (int6)((ulong)uVar5 >> 0x10);
              }
              else {
                _Var16._M_head_impl =
                     (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (_Var16._M_head_impl == (unsigned_long *)0x0) {
                  local_88.type_._0_8_ =
                       (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)local_f8,(unsigned_long *)&local_88);
                  peVar10 = apeStack_f0[0];
                  auVar9 = local_f8;
                  local_f8 = (undefined1  [8])0x0;
                  apeStack_f0[0] = (element_type *)0x0;
                  p_Var4 = (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)auVar9;
                  (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar10;
                  if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
                     apeStack_f0[0] != (element_type *)0x0)) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apeStack_f0[0]);
                  }
                  pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)local_168.count);
                  _Var16._M_head_impl =
                       (pTVar13->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       _Var16._M_head_impl;
                }
                bVar7 = (byte)pVVar26 & 0x3f;
                _Var16._M_head_impl[(ulong)pVVar26 >> 6] =
                     _Var16._M_head_impl[(ulong)pVVar26 >> 6] &
                     (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
              }
              pVVar26 = (pointer)&pVVar26->field_0x1;
              psVar29 = psVar29 + 1;
              lVar20 = lVar20 + 0x48;
              pVVar21 = (pointer)((long)pVVar21 + -1);
            } while (pVVar21 != (pointer)0x0);
            uVar19 = local_128->count;
            pVVar21 = local_118;
            pVVar26 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)local_168.capacity;
          }
          *(ulong *)((long)local_168.vector_caches.
                           super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                           super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                           ._M_impl.super__Vector_impl_data._M_finish + uVar24 * 0x10) =
               uVar24 * (long)pVVar21;
          *(pointer *)
           ((long)local_168.vector_caches.
                  super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                  super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                  _M_impl.super__Vector_impl_data._M_finish + uVar24 * 0x10 + 8) = pVVar21;
          uVar24 = uVar24 + 1;
          pVVar26 = (pointer)(&pVVar26->vector_type + (long)pVVar21);
          psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                    (&(local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage)->vector_type +
                    (long)&psVar29->internal);
        } while (uVar24 < uVar19);
      }
      ListVector::SetListSize(local_120,uVar19 * (long)pVVar21);
      break;
    case LIST:
      pVVar21 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                super__Vector_impl_data._M_start;
      pVVar26 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                super__Vector_impl_data._M_finish;
      local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)(((long)pVVar26 - (long)pVVar21 >> 3) * 0x4ec4ec4ec4ec4ec5);
      ListVector::Reserve(result,args->count *
                                 (long)local_168.data.
                                       super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       .
                                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_88.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_88.type_._0_8_ = (pointer)0x0;
      local_88.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_108._8_8_ = (pointer)0x0;
      local_118 = pVVar26;
      local_110 = pVVar21;
      if (pVVar26 != pVVar21) {
        bVar30 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage == (pointer)0x0;
        pVVar28 = &(local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage)->vector_type;
        puVar27 = (undefined1 *)0x0;
        do {
          if (local_88.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)
              local_88.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi) {
            ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_88,
                       (iterator)
                       local_88.type_.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       (unsigned_long *)(local_108 + 8));
          }
          else {
            (local_88.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_ExtraTypeInfo = local_108._8_8_;
            local_88.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)
                 ((long)local_88.type_.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 + 8);
          }
          pvVar11 = vector<duckdb::Vector,_true>::operator[](&args->data,(size_type)puVar27);
          iVar25 = ListVector::GetListSize(pvVar11);
          local_108._8_8_ = (VectorType *)local_108._8_8_ + iVar25;
          puVar27 = puVar27 + 1;
        } while (pVVar28 + bVar30 != puVar27);
      }
      pVVar12 = local_120;
      pVVar14 = ListVector::GetEntry(local_120);
      ListVector::Reserve(pVVar14,local_108._8_8_);
      local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish = pVVar14;
      local_168.count = (idx_t)ListVector::GetEntry(pVVar14);
      if (local_118 != local_110) {
        bVar30 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage == (pointer)0x0;
        pVVar28 = &(local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage)->vector_type;
        puVar27 = (undefined1 *)0x0;
        do {
          pvVar11 = vector<duckdb::Vector,_true>::operator[](&local_128->data,(size_type)puVar27);
          Vector::Vector((Vector *)local_f8,pvVar11);
          iVar25 = ListVector::GetListSize((Vector *)local_f8);
          if (iVar25 != 0) {
            pVVar14 = ListVector::GetEntry((Vector *)local_f8);
            pvVar15 = vector<unsigned_long,_true>::operator[]
                                ((vector<unsigned_long,_true> *)&local_88,(size_type)puVar27);
            VectorOperations::Copy(pVVar14,(Vector *)local_168.count,iVar25,0,*pvVar15);
          }
          if (local_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98._M_pi);
          }
          if (local_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8._M_pi);
          }
          if (local_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0._M_pi);
          }
          LogicalType::~LogicalType((LogicalType *)apeStack_f0);
          puVar27 = puVar27 + 1;
        } while (pVVar28 + bVar30 != puVar27);
      }
      local_38 = pVVar12->data;
      pdVar23 = (local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data._M_finish)->data;
      FlatVector::VerifyFlatVector
                (local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      pDVar8 = local_128;
      DataChunk::ToUnifiedFormat((DataChunk *)local_108);
      uVar19 = pDVar8->count;
      if (uVar19 == 0) {
        uVar19 = 0;
      }
      else {
        local_168.vector_caches.
        super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
        super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)&((local_168.data.
                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_finish)->validity).
                       super_TemplatedValidityMask<unsigned_long>.validity_data;
        local_168.capacity =
             (idx_t)(&(local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage)->vector_type +
                    (local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage == (pointer)0x0));
        psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)(pdVar23 + 8);
        local_40 = (long)local_168.data.
                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage << 4;
        local_168.vector_caches.
        super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
        super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        uVar24 = 0;
        do {
          if (local_118 != local_110) {
            pVVar12 = (Vector *)0x10;
            pdVar23 = (data_ptr_t)0x0;
            local_168.vector_caches.
            super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
            super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)psVar29;
            do {
              pVVar21 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                        .super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                        .super__Vector_impl_data._M_finish;
              lVar20 = **(long **)((long)&(((original *)&pVVar12->vector_type)->
                                          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr +
                                  (long)&(((pointer)(local_108._0_8_ + -0x68))->auxiliary).internal.
                                         super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr);
              uVar19 = uVar24;
              if (lVar20 != 0) {
                uVar19 = (ulong)*(uint *)(lVar20 + uVar24 * 4);
              }
              lVar20 = *(long *)((long)&(((original *)&pVVar12->vector_type)->
                                        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr +
                                (long)&(((pointer)(local_108._0_8_ + -0x68))->auxiliary).internal.
                                       super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi);
              lVar3 = *(long *)((long)&(((original *)&pVVar12->vector_type)->
                                       super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr + (long)(SelectionVector **)local_108._0_8_);
              if ((lVar3 == 0) ||
                 ((*(ulong *)(lVar3 + (uVar19 >> 6) * 8) >> (uVar19 & 0x3f) & 1) != 0)) {
                uVar5 = *(undefined8 *)(lVar20 + 8 + uVar19 * 0x10);
                local_168.count = (idx_t)pVVar12;
                pvVar15 = vector<unsigned_long,_true>::operator[]
                                    ((vector<unsigned_long,_true> *)&local_88,(size_type)pdVar23);
                *(value_type *)((long)(psVar29 + -1) + 8) =
                     *(long *)(lVar20 + uVar19 * 0x10) + *pvVar15;
                *(undefined8 *)&psVar29->internal = uVar5;
                pVVar12 = (Vector *)local_168.count;
              }
              else {
                _Var16._M_head_impl =
                     ((local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_finish)->validity).
                     super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (_Var16._M_head_impl == (unsigned_long *)0x0) {
                  local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       (pointer)((local_168.data.
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_finish)->validity).
                                super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)local_f8,(unsigned_long *)&local_168);
                  peVar10 = apeStack_f0[0];
                  auVar9 = local_f8;
                  local_f8 = (undefined1  [8])0x0;
                  apeStack_f0[0] = (element_type *)0x0;
                  p_Var4 = (pVVar21->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (pVVar21->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)auVar9;
                  (pVVar21->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar10;
                  if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
                     apeStack_f0[0] != (element_type *)0x0)) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apeStack_f0[0]);
                  }
                  pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)local_168.vector_caches.
                                          super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                          .
                                          super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  _Var16._M_head_impl =
                       (pTVar13->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                  ((local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish)->validity).
                  super_TemplatedValidityMask<unsigned_long>.validity_mask = _Var16._M_head_impl;
                }
                bVar7 = (byte)(pdVar23 +
                              (long)local_168.vector_caches.
                                    super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                    .
                                    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                    ._M_impl.super__Vector_impl_data._M_start) & 0x3f;
                _Var16._M_head_impl
                [(ulong)(pdVar23 +
                        (long)local_168.vector_caches.
                              super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                              .
                              super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 6] =
                     _Var16._M_head_impl
                     [(ulong)(pdVar23 +
                             (long)local_168.vector_caches.
                                   super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                   .
                                   super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 6] &
                     (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
              }
              pdVar23 = pdVar23 + 1;
              psVar29 = psVar29 + 1;
              pVVar12 = (Vector *)&pVVar12->buffer;
            } while ((data_ptr_t)local_168.capacity != pdVar23);
            uVar19 = local_128->count;
            psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                      local_168.vector_caches.
                      super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            pVVar12 = local_120;
          }
          *(ulong *)(local_38 + uVar24 * 0x10) =
               uVar24 * (long)local_168.data.
                              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage;
          *(pointer *)(local_38 + uVar24 * 0x10 + 8) =
               local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          uVar24 = uVar24 + 1;
          local_168.vector_caches.
          super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
          super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)(&(local_168.data.
                           super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage)->vector_type +
                        (long)local_168.vector_caches.
                              super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                              .
                              super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                              ._M_impl.super__Vector_impl_data._M_start);
          psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                    ((long)&(psVar29->internal).
                            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + local_40);
        } while (uVar24 < uVar19);
      }
      ListVector::SetListSize
                (pVVar12,uVar19 * (long)local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ListVector::SetListSize
                (local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                 super__Vector_impl_data._M_finish,local_108._8_8_);
      if ((pointer)local_108._0_8_ != (pointer)0x0) {
        ::std::default_delete<duckdb::UnifiedVectorFormat[]>::operator()
                  ((default_delete<duckdb::UnifiedVectorFormat[]> *)local_108,
                   (UnifiedVectorFormat *)local_108._0_8_);
      }
      if ((pointer)local_88.type_._0_8_ == (pointer)0x0) {
        return;
      }
      operator_delete((void *)local_88.type_._0_8_);
      return;
    }
  }
  else if (PVar2 == VARCHAR) {
    local_168.vector_caches.super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_168.vector_caches.super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    lVar20 = (long)local_168.vector_caches.
                   super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                   super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage -
             (long)local_168.vector_caches.
                   super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                   super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    pVVar21 = (pointer)(lVar20 * 0x4ec4ec4ec4ec4ec5);
    ListVector::Reserve(result,args->count * (long)pVVar21);
    local_168.vector_caches.super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)result->data;
    pVVar12 = ListVector::GetEntry(result);
    pdVar23 = pVVar12->data;
    FlatVector::VerifyFlatVector(pVVar12);
    DataChunk::ToUnifiedFormat(&local_168);
    uVar19 = args->count;
    if (uVar19 == 0) {
      uVar19 = 0;
    }
    else {
      local_168.count =
           (idx_t)&(pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      local_110 = (pointer)((long)pVVar21 + (ulong)(pVVar21 == (pointer)0x0));
      psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)(pdVar23 + 8);
      local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)(lVar20 * -0x13b13b13b13b13b0);
      pVVar26 = (pointer)0x0;
      uVar24 = 0;
      local_118 = pVVar21;
      do {
        if (local_168.vector_caches.
            super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
            super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage !=
            local_168.vector_caches.
            super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
            super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
            super__Vector_impl_data._M_start) {
          lVar20 = 0x10;
          pVVar21 = local_110;
          local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_finish = pVVar26;
          local_168.capacity = (idx_t)psVar29;
          do {
            lVar3 = **(long **)((long)local_168.data.
                                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar20 + -0x10);
            uVar19 = uVar24;
            if (lVar3 != 0) {
              uVar19 = (ulong)*(uint *)(lVar3 + uVar24 * 4);
            }
            lVar3 = *(long *)((long)local_168.data.
                                    super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar20 + -8);
            lVar6 = *(long *)((long)&(local_168.data.
                                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->vector_type +
                             lVar20);
            if ((lVar6 == 0) ||
               ((*(ulong *)(lVar6 + (uVar19 >> 6) * 8) >> (uVar19 & 0x3f) & 1) != 0)) {
              sVar31.value.pointer.ptr = (char *)lVar3;
              sVar31.value._0_8_ = *(undefined8 *)(lVar3 + 8 + uVar19 * 0x10);
              sVar31 = StringVector::AddStringOrBlob
                                 ((StringVector *)pVVar12,*(Vector **)(lVar3 + uVar19 * 0x10),sVar31
                                 );
              *(long *)((long)(psVar29 + -1) + 8) = sVar31.value._0_8_;
              *(long *)&psVar29->internal = sVar31.value._8_8_;
            }
            else {
              _Var16._M_head_impl =
                   (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (_Var16._M_head_impl == (unsigned_long *)0x0) {
                local_88.type_._0_8_ =
                     (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)local_f8,(unsigned_long *)&local_88);
                peVar10 = apeStack_f0[0];
                auVar9 = local_f8;
                local_f8 = (undefined1  [8])0x0;
                apeStack_f0[0] = (element_type *)0x0;
                p_Var4 = (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.
                         validity_data.internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)auVar9;
                (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar10;
                if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
                   apeStack_f0[0] != (element_type *)0x0)) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apeStack_f0[0]);
                }
                pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                      *)local_168.count);
                _Var16._M_head_impl =
                     (pTVar13->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     _Var16._M_head_impl;
              }
              bVar7 = (byte)pVVar26 & 0x3f;
              _Var16._M_head_impl[(ulong)pVVar26 >> 6] =
                   _Var16._M_head_impl[(ulong)pVVar26 >> 6] &
                   (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
            }
            pVVar26 = (pointer)&pVVar26->field_0x1;
            psVar29 = psVar29 + 1;
            lVar20 = lVar20 + 0x48;
            pVVar21 = (pointer)((long)pVVar21 + -1);
          } while (pVVar21 != (pointer)0x0);
          uVar19 = local_128->count;
          pVVar21 = local_118;
          pVVar26 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)local_168.capacity;
        }
        *(ulong *)((long)local_168.vector_caches.
                         super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                         super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                         ._M_impl.super__Vector_impl_data._M_finish + uVar24 * 0x10) =
             uVar24 * (long)pVVar21;
        *(pointer *)
         ((long)local_168.vector_caches.
                super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                _M_impl.super__Vector_impl_data._M_finish + uVar24 * 0x10 + 8) = pVVar21;
        uVar24 = uVar24 + 1;
        pVVar26 = (pointer)(&pVVar26->vector_type + (long)pVVar21);
        psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                  (&(local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage)->vector_type +
                  (long)&psVar29->internal);
      } while (uVar24 < uVar19);
    }
    ListVector::SetListSize(local_120,uVar19 * (long)pVVar21);
  }
  else if (PVar2 == UINT128) {
    local_168.vector_caches.super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_168.vector_caches.super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    lVar20 = (long)local_168.vector_caches.
                   super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                   super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage -
             (long)local_168.vector_caches.
                   super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                   super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    pVVar21 = (pointer)(lVar20 * 0x4ec4ec4ec4ec4ec5);
    ListVector::Reserve(result,args->count * (long)pVVar21);
    local_168.vector_caches.super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)result->data;
    pVVar12 = ListVector::GetEntry(result);
    psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)pVVar12->data;
    FlatVector::VerifyFlatVector(pVVar12);
    DataChunk::ToUnifiedFormat(&local_168);
    uVar19 = args->count;
    if (uVar19 == 0) {
      uVar19 = 0;
    }
    else {
      local_168.count =
           (idx_t)&(pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      local_110 = (pointer)((long)pVVar21 + (ulong)(pVVar21 == (pointer)0x0));
      local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)(lVar20 * -0x13b13b13b13b13b0);
      pVVar26 = (pointer)0x0;
      uVar24 = 0;
      local_118 = pVVar21;
      do {
        if (local_168.vector_caches.
            super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
            super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage !=
            local_168.vector_caches.
            super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
            super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
            super__Vector_impl_data._M_start) {
          lVar20 = 0x10;
          pVVar21 = local_110;
          local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_finish = pVVar26;
          local_168.capacity = (idx_t)psVar29;
          do {
            lVar3 = **(long **)((long)local_168.data.
                                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar20 + -0x10);
            uVar19 = uVar24;
            if (lVar3 != 0) {
              uVar19 = (ulong)*(uint *)(lVar3 + uVar24 * 4);
            }
            lVar3 = *(long *)((long)&(local_168.data.
                                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->vector_type +
                             lVar20);
            if ((lVar3 == 0) ||
               ((*(ulong *)(lVar3 + (uVar19 >> 6) * 8) >> (uVar19 & 0x3f) & 1) != 0)) {
              puVar1 = (undefined8 *)
                       (*(long *)((long)local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar20 + -8) +
                       uVar19 * 0x10);
              uVar5 = puVar1[1];
              *(undefined8 *)&psVar29->internal = *puVar1;
              pLVar17 = (LogicalType *)((long)&psVar29->internal + 8);
              pLVar17->id_ = (char)uVar5;
              pLVar17->physical_type_ = (char)((ulong)uVar5 >> 8);
              *(int6 *)&pLVar17->field_0x2 = (int6)((ulong)uVar5 >> 0x10);
            }
            else {
              _Var16._M_head_impl =
                   (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (_Var16._M_head_impl == (unsigned_long *)0x0) {
                local_88.type_._0_8_ =
                     (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)local_f8,(unsigned_long *)&local_88);
                peVar10 = apeStack_f0[0];
                auVar9 = local_f8;
                local_f8 = (undefined1  [8])0x0;
                apeStack_f0[0] = (element_type *)0x0;
                p_Var4 = (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.
                         validity_data.internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)auVar9;
                (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar10;
                if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
                   apeStack_f0[0] != (element_type *)0x0)) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apeStack_f0[0]);
                }
                pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                      *)local_168.count);
                _Var16._M_head_impl =
                     (pTVar13->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     _Var16._M_head_impl;
              }
              bVar7 = (byte)pVVar26 & 0x3f;
              _Var16._M_head_impl[(ulong)pVVar26 >> 6] =
                   _Var16._M_head_impl[(ulong)pVVar26 >> 6] &
                   (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
            }
            pVVar26 = (pointer)&pVVar26->field_0x1;
            psVar29 = psVar29 + 1;
            lVar20 = lVar20 + 0x48;
            pVVar21 = (pointer)((long)pVVar21 + -1);
          } while (pVVar21 != (pointer)0x0);
          uVar19 = local_128->count;
          pVVar21 = local_118;
          pVVar26 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)local_168.capacity;
        }
        *(ulong *)((long)local_168.vector_caches.
                         super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                         super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                         ._M_impl.super__Vector_impl_data._M_finish + uVar24 * 0x10) =
             uVar24 * (long)pVVar21;
        *(pointer *)
         ((long)local_168.vector_caches.
                super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                _M_impl.super__Vector_impl_data._M_finish + uVar24 * 0x10 + 8) = pVVar21;
        uVar24 = uVar24 + 1;
        pVVar26 = (pointer)(&pVVar26->vector_type + (long)pVVar21);
        psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                  (&(local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage)->vector_type +
                  (long)&psVar29->internal);
      } while (uVar24 < uVar19);
    }
    ListVector::SetListSize(local_120,uVar19 * (long)pVVar21);
  }
  else {
    if (PVar2 != INT128) goto switchD_00f98dc9_caseD_a;
    local_168.vector_caches.super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_168.vector_caches.super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    lVar20 = (long)local_168.vector_caches.
                   super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                   super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage -
             (long)local_168.vector_caches.
                   super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                   super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    pVVar21 = (pointer)(lVar20 * 0x4ec4ec4ec4ec4ec5);
    ListVector::Reserve(result,args->count * (long)pVVar21);
    local_168.vector_caches.super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
    super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)result->data;
    pVVar12 = ListVector::GetEntry(result);
    psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)pVVar12->data;
    FlatVector::VerifyFlatVector(pVVar12);
    DataChunk::ToUnifiedFormat(&local_168);
    uVar19 = args->count;
    if (uVar19 == 0) {
      uVar19 = 0;
    }
    else {
      local_168.count =
           (idx_t)&(pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      local_110 = (pointer)((long)pVVar21 + (ulong)(pVVar21 == (pointer)0x0));
      local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)(lVar20 * -0x13b13b13b13b13b0);
      pVVar26 = (pointer)0x0;
      uVar24 = 0;
      local_118 = pVVar21;
      do {
        if (local_168.vector_caches.
            super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
            super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage !=
            local_168.vector_caches.
            super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
            super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>._M_impl.
            super__Vector_impl_data._M_start) {
          lVar20 = 0x10;
          pVVar21 = local_110;
          local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
          super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
          super__Vector_impl_data._M_finish = pVVar26;
          local_168.capacity = (idx_t)psVar29;
          do {
            lVar3 = **(long **)((long)local_168.data.
                                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar20 + -0x10);
            uVar19 = uVar24;
            if (lVar3 != 0) {
              uVar19 = (ulong)*(uint *)(lVar3 + uVar24 * 4);
            }
            lVar3 = *(long *)((long)&(local_168.data.
                                      super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->vector_type +
                             lVar20);
            if ((lVar3 == 0) ||
               ((*(ulong *)(lVar3 + (uVar19 >> 6) * 8) >> (uVar19 & 0x3f) & 1) != 0)) {
              puVar1 = (undefined8 *)
                       (*(long *)((long)local_168.data.
                                        super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        .
                                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar20 + -8) +
                       uVar19 * 0x10);
              uVar5 = puVar1[1];
              *(undefined8 *)&psVar29->internal = *puVar1;
              pLVar17 = (LogicalType *)((long)&psVar29->internal + 8);
              pLVar17->id_ = (char)uVar5;
              pLVar17->physical_type_ = (char)((ulong)uVar5 >> 8);
              *(int6 *)&pLVar17->field_0x2 = (int6)((ulong)uVar5 >> 0x10);
            }
            else {
              _Var16._M_head_impl =
                   (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (_Var16._M_head_impl == (unsigned_long *)0x0) {
                local_88.type_._0_8_ =
                     (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)local_f8,(unsigned_long *)&local_88);
                peVar10 = apeStack_f0[0];
                auVar9 = local_f8;
                local_f8 = (undefined1  [8])0x0;
                apeStack_f0[0] = (element_type *)0x0;
                p_Var4 = (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.
                         validity_data.internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)auVar9;
                (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar10;
                if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
                   apeStack_f0[0] != (element_type *)0x0)) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)apeStack_f0[0]);
                }
                pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                      *)local_168.count);
                _Var16._M_head_impl =
                     (pTVar13->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     _Var16._M_head_impl;
              }
              bVar7 = (byte)pVVar26 & 0x3f;
              _Var16._M_head_impl[(ulong)pVVar26 >> 6] =
                   _Var16._M_head_impl[(ulong)pVVar26 >> 6] &
                   (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
            }
            pVVar26 = (pointer)&pVVar26->field_0x1;
            psVar29 = psVar29 + 1;
            lVar20 = lVar20 + 0x48;
            pVVar21 = (pointer)((long)pVVar21 + -1);
          } while (pVVar21 != (pointer)0x0);
          uVar19 = local_128->count;
          pVVar21 = local_118;
          pVVar26 = local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                    super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)local_168.capacity;
        }
        *(ulong *)((long)local_168.vector_caches.
                         super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                         super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>
                         ._M_impl.super__Vector_impl_data._M_finish + uVar24 * 0x10) =
             uVar24 * (long)pVVar21;
        *(pointer *)
         ((long)local_168.vector_caches.
                super_vector<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                super__Vector_base<duckdb::VectorCache,_std::allocator<duckdb::VectorCache>_>.
                _M_impl.super__Vector_impl_data._M_finish + uVar24 * 0x10 + 8) = pVVar21;
        uVar24 = uVar24 + 1;
        pVVar26 = (pointer)(&pVVar26->vector_type + (long)pVVar21);
        psVar29 = (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                  (&(local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage)->vector_type +
                  (long)&psVar29->internal);
      } while (uVar24 < uVar19);
    }
    ListVector::SetListSize(local_120,uVar19 * (long)pVVar21);
  }
  if (local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    ::std::default_delete<duckdb::UnifiedVectorFormat[]>::operator()
              ((default_delete<duckdb::UnifiedVectorFormat[]> *)&local_168,
               (UnifiedVectorFormat *)
               local_168.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void ListValueFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(result.GetType().id() == LogicalTypeId::LIST);
	result.SetVectorType(VectorType::CONSTANT_VECTOR);
	if (args.ColumnCount() == 0) {
		// no columns - early out - result is a constant empty list
		auto result_data = FlatVector::GetData<list_entry_t>(result);
		result_data[0].length = 0;
		result_data[0].offset = 0;
		return;
	}
	for (idx_t i = 0; i < args.ColumnCount(); i++) {
		if (args.data[i].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::FLAT_VECTOR);
		}
	}
	auto &result_type = ListVector::GetEntry(result).GetType();
	switch (result_type.InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		TemplatedListValueFunction<int8_t>(args, result);
		break;
	case PhysicalType::INT16:
		TemplatedListValueFunction<int16_t>(args, result);
		break;
	case PhysicalType::INT32:
		TemplatedListValueFunction<int32_t>(args, result);
		break;
	case PhysicalType::INT64:
		TemplatedListValueFunction<int64_t>(args, result);
		break;
	case PhysicalType::UINT8:
		TemplatedListValueFunction<uint8_t>(args, result);
		break;
	case PhysicalType::UINT16:
		TemplatedListValueFunction<uint16_t>(args, result);
		break;
	case PhysicalType::UINT32:
		TemplatedListValueFunction<uint32_t>(args, result);
		break;
	case PhysicalType::UINT64:
		TemplatedListValueFunction<uint64_t>(args, result);
		break;
	case PhysicalType::INT128:
		TemplatedListValueFunction<hugeint_t>(args, result);
		break;
	case PhysicalType::UINT128:
		TemplatedListValueFunction<uhugeint_t>(args, result);
		break;
	case PhysicalType::FLOAT:
		TemplatedListValueFunction<float>(args, result);
		break;
	case PhysicalType::DOUBLE:
		TemplatedListValueFunction<double>(args, result);
		break;
	case PhysicalType::INTERVAL:
		TemplatedListValueFunction<interval_t>(args, result);
		break;
	case PhysicalType::VARCHAR:
		TemplatedListValueFunction<string_t, ListValueStringAssign>(args, result);
		break;
	case PhysicalType::LIST:
		ListValueListFunction(args, result);
		break;
	default: {
		TemplatedListValueFunctionFallback(args, result);
		break;
	}
	}
}